

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_inflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGDecompressSettings *settings)

{
  ushort uVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  HuffmanTree *pHVar9;
  ulong uVar10;
  long lVar11;
  byte bVar12;
  uint uVar13;
  uint *puVar14;
  HuffmanTree *pHVar15;
  int iVar16;
  uchar *puVar17;
  HuffmanTree *pHVar18;
  uint *puVar19;
  HuffmanTree *pHVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  HuffmanTree *pHVar24;
  bool bVar25;
  LodePNGBitReader local_148;
  HuffmanTree *local_120;
  uint local_114;
  ulong local_110;
  uint local_108;
  uint local_104;
  ucvector v;
  HuffmanTree tree_ll;
  HuffmanTree local_88;
  HuffmanTree local_58;
  
  v.data = *out;
  pHVar18 = (HuffmanTree *)*outsize;
  local_148.bitsize = insize * 8;
  v.size = (size_t)pHVar18;
  if (local_148.bitsize < 0xffffffffffffffc0 && insize >> 0x3d == 0) {
    local_148.bp = 0;
    local_148.buffer = 0;
    uVar6 = 0;
    pHVar24 = (HuffmanTree *)0x0;
    local_148.data = in;
    local_148.size = insize;
    v.allocsize = (size_t)pHVar18;
    do {
      if (uVar6 != 0) {
        uVar4 = 0;
        break;
      }
      uVar4 = ensureBits9(&local_148,(size_t)pHVar18);
      sVar3 = local_148.size;
      if (uVar4 == 0) {
LAB_0010f10e:
        uVar4 = 0x34;
        break;
      }
      pHVar18 = (HuffmanTree *)(ulong)local_148.buffer;
      uVar10 = local_148.bp + 3;
      uVar4 = local_148.buffer >> 1 & 3;
      local_104 = local_148.buffer;
      if (uVar4 == 0) {
        uVar21 = local_148.bp + 10 >> 3;
        pHVar18 = (HuffmanTree *)(uVar21 + 4);
        if (local_148.size <= pHVar18) goto LAB_0010f10e;
        uVar1 = *(ushort *)((long)(uint **)local_148.data + uVar21);
        uVar8 = (ulong)uVar1;
        if ((settings->ignore_nlen == 0) &&
           ((uint)*(ushort *)((long)(uint **)local_148.data + uVar21 + 2) + (uint)uVar1 != 0xffff))
        {
          uVar4 = 0x15;
          break;
        }
        local_120 = (HuffmanTree *)local_148.data;
        pHVar9 = (HuffmanTree *)((long)&pHVar24->codes + uVar8);
        local_148.bp = uVar10;
        local_148.buffer = local_148.buffer >> 3;
        uVar4 = ucvector_resize(&v,(size_t)pHVar9);
        if (uVar4 == 0) {
          uVar4 = 0x53;
          break;
        }
        pHVar20 = (HuffmanTree *)((long)&pHVar18->codes + uVar8);
        if (sVar3 < pHVar20) {
          uVar4 = 0x17;
          break;
        }
        pHVar18 = (HuffmanTree *)((long)&pHVar18->codes + (long)&local_120->codes);
        lodepng_memcpy(v.data + (long)&pHVar24->codes,pHVar18,uVar8);
        local_148.bp = (long)pHVar20 * 8;
        uVar4 = 0;
      }
      else {
        if (uVar4 == 3) {
          uVar4 = 0x14;
          break;
        }
        tree_ll.codes = (uint *)0x0;
        tree_ll.lengths = (uint *)0x0;
        tree_ll.table_len = (uchar *)0x0;
        tree_ll.table_value = (unsigned_short *)0x0;
        local_88.codes = (uint *)0x0;
        local_88.lengths = (uint *)0x0;
        local_88.table_len = (uchar *)0x0;
        local_88.table_value = (unsigned_short *)0x0;
        if (uVar4 == 1) {
          local_148.bp = uVar10;
          local_148.buffer = local_148.buffer >> 3;
          generateFixedLitLenTree(&tree_ll);
          generateFixedDistanceTree(&local_88);
          uVar4 = 0;
          uVar10 = local_148.bp;
        }
        else {
          pHVar9 = (HuffmanTree *)(uVar10 >> 3);
          pHVar18 = (HuffmanTree *)((long)&pHVar9->codes + 2);
          if (pHVar18 < local_148.size) {
            uVar1 = *(ushort *)((long)&pHVar9->codes + (long)(uint **)local_148.data);
            pHVar18 = (HuffmanTree *)(ulong)uVar1;
            uVar21 = (ulong)(uint3)(CONCAT12(((undefined1 *)((long)(uint **)local_148.data + 2))
                                             [(long)pHVar9],uVar1) >> ((byte)uVar10 & 7));
          }
          else {
            local_148.buffer = 0;
            if (pHVar9 < local_148.size) {
              local_148.buffer =
                   (uint)*(byte *)((long)&pHVar9->codes + (long)(uint **)local_148.data);
              pHVar18 = (HuffmanTree *)local_148.data;
            }
            pHVar9 = (HuffmanTree *)((long)&pHVar9->codes + 1);
            if (pHVar9 < local_148.size) {
              local_148.buffer =
                   local_148.buffer |
                   (uint)*(byte *)((long)&pHVar9->codes + (long)(uint **)local_148.data) << 8;
            }
            local_148.buffer = local_148.buffer >> ((byte)uVar10 & 7);
            uVar21 = (ulong)local_148.buffer;
            uVar4 = 0x31;
            if (local_148.bitsize <= local_148.bp + 0x11) goto LAB_0010ee20;
          }
          uVar8 = local_148.bp + 0x11;
          local_148.buffer = (uint)(uVar21 >> 0xe);
          local_148.bp = uVar8;
          pHVar9 = (HuffmanTree *)malloc(0x4c);
          uVar4 = 0x53;
          uVar10 = local_148.bp;
          if (pHVar9 != (HuffmanTree *)0x0) {
            uVar4 = (uint)(uVar21 >> 10) & 0xf;
            uVar22 = (ulong)uVar4;
            local_58.codes = (uint *)0x0;
            local_58.lengths = (uint *)0x0;
            local_58.table_len = (uchar *)0x0;
            local_58.table_value = (unsigned_short *)0x0;
            uVar10 = (uVar4 + 4) * 3 + uVar8;
            local_120 = pHVar24;
            if (uVar10 < uVar8) {
              uVar4 = 0x32;
LAB_0010eb6d:
              pHVar24 = (HuffmanTree *)0x0;
              pHVar20 = (HuffmanTree *)0x0;
            }
            else {
              uVar4 = 0x32;
              pHVar24 = (HuffmanTree *)0x0;
              pHVar20 = (HuffmanTree *)0x0;
              if (uVar10 <= local_148.bitsize) {
                local_114 = (uint)uVar21 & 0x1f;
                local_110 = (ulong)local_114;
                local_114 = local_114 + 0x101;
                for (lVar11 = 0; uVar22 * 4 + 0x10 != lVar11; lVar11 = lVar11 + 4) {
                  ensureBits9(&local_148,(size_t)pHVar18);
                  local_148.bp = local_148.bp + 3;
                  *(uint *)((long)&pHVar9->codes + (ulong)*(uint *)((long)CLCL_ORDER + lVar11) * 4)
                       = local_148.buffer & 7;
                  local_148.buffer = local_148.buffer >> 3;
                }
                for (; uVar22 != 0xf; uVar22 = uVar22 + 1) {
                  *(undefined4 *)((long)&pHVar9->codes + (ulong)CLCL_ORDER[uVar22 + 4] * 4) = 0;
                }
                pHVar18 = pHVar9;
                uVar4 = HuffmanTree_makeFromLengths(&local_58,(uint *)pHVar9,0x13,7);
                if (uVar4 != 0) goto LAB_0010eb6d;
                pHVar24 = (HuffmanTree *)malloc(0x480);
                pHVar20 = (HuffmanTree *)malloc(0x80);
                if (pHVar20 == (HuffmanTree *)0x0 || pHVar24 == (HuffmanTree *)0x0) {
                  uVar4 = 0x53;
                }
                else {
                  for (lVar11 = 0; lVar11 != 0x120; lVar11 = lVar11 + 1) {
                    *(undefined4 *)((long)&pHVar24->codes + lVar11 * 4) = 0;
                  }
                  for (lVar11 = 0; lVar11 != 0x20; lVar11 = lVar11 + 1) {
                    *(undefined4 *)((long)&pHVar20->codes + lVar11 * 4) = 0;
                  }
                  uVar6 = ((uint)uVar21 >> 5 & 0x1f) + 1 + local_114;
                  uVar21 = (ulong)uVar6;
                  local_108 = (int)local_110 + 0x102;
                  uVar8 = (ulong)local_114;
                  uVar4 = -(int)local_110;
                  local_110 = (ulong)uVar4;
                  iVar2 = uVar4 - 0x101;
                  uVar4 = 0;
                  uVar10 = 0;
                  do {
                    uVar7 = (uint)uVar10;
                    if (uVar6 <= uVar7) {
                      if (uVar4 == 0) {
                        pHVar18 = pHVar24;
                        if (*(int *)&pHVar24[0x19].table_len == 0) {
                          uVar4 = 0x40;
                        }
                        else {
                          uVar4 = HuffmanTree_makeFromLengths(&tree_ll,(uint *)pHVar24,0x120,0xf);
                          if (uVar4 == 0) {
                            pHVar18 = pHVar20;
                            uVar4 = HuffmanTree_makeFromLengths(&local_88,(uint *)pHVar20,0x20,0xf);
                          }
                        }
                      }
                      goto LAB_0010edeb;
                    }
                    ensureBits25(&local_148,0x16);
                    pHVar18 = &local_58;
                    uVar5 = huffmanDecodeSymbol(&local_148,pHVar18);
                    if (uVar5 < 0x10) {
                      pHVar15 = pHVar20;
                      uVar13 = local_114;
                      if (uVar7 < local_114) {
                        uVar13 = 0;
                        pHVar15 = pHVar24;
                      }
                      pHVar18 = (HuffmanTree *)(ulong)(uVar7 - uVar13);
                      *(uint *)((long)&pHVar15->codes + (long)pHVar18 * 4) = uVar5;
                      uVar10 = (ulong)(uVar7 + 1);
                    }
                    else {
                      uVar10 = uVar10 & 0xffffffff;
                      if (uVar5 == 0x12) {
                        uVar7 = local_148.buffer & 0x7f;
                        local_148.buffer = local_148.buffer >> 7;
                        local_148.bp = local_148.bp + 7;
                        iVar16 = uVar7 + 0xb;
                        pHVar18 = (HuffmanTree *)((long)&pHVar24->codes + uVar10 * 4);
                        while (bVar25 = iVar16 != 0, iVar16 = iVar16 + -1, bVar25) {
                          if (uVar21 == uVar10) {
                            uVar4 = 0xf;
                            break;
                          }
                          pHVar15 = (HuffmanTree *)
                                    ((long)&pHVar20->codes + (ulong)(uint)(iVar2 + (int)uVar10) * 4)
                          ;
                          if (uVar10 < uVar8) {
                            pHVar15 = pHVar18;
                          }
                          *(undefined4 *)&pHVar15->codes = 0;
                          uVar10 = uVar10 + 1;
                          pHVar18 = (HuffmanTree *)((long)&pHVar18->codes + 4);
                        }
                      }
                      else if (uVar5 == 0x11) {
                        uVar7 = local_148.buffer & 7;
                        local_148.buffer = local_148.buffer >> 3;
                        local_148.bp = local_148.bp + 3;
                        iVar16 = uVar7 + 3;
                        pHVar18 = (HuffmanTree *)((long)&pHVar24->codes + uVar10 * 4);
                        while (bVar25 = iVar16 != 0, iVar16 = iVar16 + -1, bVar25) {
                          if (uVar21 == uVar10) {
                            uVar4 = 0xe;
                            break;
                          }
                          pHVar15 = (HuffmanTree *)
                                    ((long)&pHVar20->codes + (ulong)(uint)(iVar2 + (int)uVar10) * 4)
                          ;
                          if (uVar10 < uVar8) {
                            pHVar15 = pHVar18;
                          }
                          *(undefined4 *)&pHVar15->codes = 0;
                          uVar10 = uVar10 + 1;
                          pHVar18 = (HuffmanTree *)((long)&pHVar18->codes + 4);
                        }
                      }
                      else {
                        if (uVar5 != 0x10) {
                          uVar4 = 0x10;
                          goto LAB_0010edeb;
                        }
                        if (uVar7 == 0) {
                          uVar4 = 0x36;
                          goto LAB_0010edeb;
                        }
                        uVar5 = local_148.buffer & 3;
                        local_148.buffer = local_148.buffer >> 2;
                        local_148.bp = local_148.bp + 2;
                        iVar16 = uVar5 + 3;
                        puVar19 = (uint *)((long)&pHVar20->codes +
                                          (ulong)((uVar7 - 0x102) + (int)local_110) * 4);
                        if (uVar7 < local_108) {
                          puVar19 = (uint *)((long)&pHVar24->codes + (ulong)(uVar7 - 1) * 4);
                        }
                        uVar7 = *puVar19;
                        pHVar18 = (HuffmanTree *)(ulong)uVar7;
                        puVar19 = (uint *)((long)&pHVar24->codes + uVar10 * 4);
                        while (bVar25 = iVar16 != 0, iVar16 = iVar16 + -1, bVar25) {
                          if (uVar21 == uVar10) {
                            uVar4 = 0xd;
                            break;
                          }
                          puVar14 = (uint *)((long)&pHVar20->codes +
                                            (ulong)(uint)(iVar2 + (int)uVar10) * 4);
                          if (uVar10 < uVar8) {
                            puVar14 = puVar19;
                          }
                          *puVar14 = uVar7;
                          uVar10 = uVar10 + 1;
                          puVar19 = puVar19 + 1;
                        }
                      }
                    }
                  } while (local_148.bp <= local_148.bitsize);
                  uVar4 = 0x32;
                }
              }
            }
LAB_0010edeb:
            free(pHVar9);
            free(pHVar24);
            free(pHVar20);
            HuffmanTree_cleanup(&local_58);
            pHVar24 = local_120;
            uVar10 = local_148.bp;
          }
        }
LAB_0010ee20:
        do {
          local_148.bp = uVar10;
          pHVar9 = &tree_ll;
          if (uVar4 != 0) goto LAB_0010f06a;
          ensureBits25(&local_148,0x14);
          uVar4 = huffmanDecodeSymbol(&local_148,pHVar9);
          if (uVar4 < 0x100) {
            pHVar9 = (HuffmanTree *)((long)&pHVar24->codes + 1);
            pHVar18 = pHVar9;
            uVar6 = ucvector_resize(&v,(size_t)pHVar9);
            if (uVar6 == 0) {
LAB_0010f041:
              uVar4 = 0x53;
              goto LAB_0010f06a;
            }
            v.data[(long)pHVar24] = (uchar)uVar4;
            pHVar24 = pHVar9;
          }
          else {
            if ((uVar4 == 0x100) || (0x11d < uVar4)) {
              uVar4 = (uint)(uVar4 != 0x100) << 4;
              pHVar18 = pHVar9;
              goto LAB_0010f06a;
            }
            uVar10 = (ulong)(uVar4 - 0x101);
            pHVar9 = (HuffmanTree *)(ulong)LENGTHBASE[uVar10];
            if (0xffffffffffffffeb < uVar10 - 0x1c) {
              local_148.bp = local_148.bp + LENGTHEXTRA[uVar10];
              pHVar9 = (HuffmanTree *)
                       ((long)&pHVar9->codes +
                       (ulong)(~(-1 << ((byte)LENGTHEXTRA[uVar10] & 0x1f)) & local_148.buffer));
            }
            pHVar18 = (HuffmanTree *)(local_148.bp >> 3);
            bVar12 = (byte)local_148.bp;
            if ((HuffmanTree *)((long)&pHVar18->codes + 4U) < local_148.size) {
              local_148.buffer =
                   ((uint)(byte)((undefined1 *)((long)(uint **)local_148.data + 4))[(long)pHVar18]
                   << 0x18) << (bVar12 & 7 ^ 7) |
                   *(uint *)((long)&pHVar18->codes + (long)(uint **)local_148.data) >> (bVar12 & 7);
            }
            else {
              local_148.buffer = 0;
              if (pHVar18 < local_148.size) {
                local_148.buffer =
                     (uint)*(byte *)((long)&pHVar18->codes + (long)(uint **)local_148.data);
              }
              pHVar20 = (HuffmanTree *)((long)&pHVar18->codes + 1);
              if (pHVar20 < local_148.size) {
                local_148.buffer =
                     local_148.buffer |
                     (uint)*(byte *)((long)&pHVar20->codes + (long)(uint **)local_148.data) << 8;
              }
              pHVar20 = (HuffmanTree *)((long)&pHVar18->codes + 2);
              if (pHVar20 < local_148.size) {
                local_148.buffer =
                     local_148.buffer |
                     (uint)*(byte *)((long)&pHVar20->codes + (long)(uint **)local_148.data) << 0x10;
              }
              pHVar18 = (HuffmanTree *)((long)&pHVar18->codes + 3);
              if (pHVar18 < local_148.size) {
                local_148.buffer =
                     local_148.buffer |
                     (uint)*(byte *)((long)&pHVar18->codes + (long)(uint **)local_148.data) << 0x18;
              }
              local_148.buffer = local_148.buffer >> (bVar12 & 7);
            }
            pHVar18 = &local_88;
            uVar4 = huffmanDecodeSymbol(&local_148,pHVar18);
            if (0x1d < uVar4) {
              uVar4 = (uint)(uVar4 < 0x20) * 2 + 0x10;
              goto LAB_0010f06a;
            }
            uVar6 = DISTANCEBASE[uVar4];
            if (3 < uVar4) {
              bVar12 = (byte)DISTANCEEXTRA[uVar4];
              uVar7 = ~(-1 << (bVar12 & 0x1f)) & local_148.buffer;
              local_148.buffer = local_148.buffer >> (bVar12 & 0x1f);
              pHVar18 = (HuffmanTree *)(ulong)local_148.buffer;
              local_148.bp = local_148.bp + DISTANCEEXTRA[uVar4];
              uVar6 = uVar6 + uVar7;
            }
            pHVar20 = (HuffmanTree *)(ulong)uVar6;
            if (pHVar24 < pHVar20) {
              uVar4 = 0x34;
              goto LAB_0010f06a;
            }
            pHVar18 = (HuffmanTree *)((long)&pHVar24->codes + (long)&pHVar9->codes);
            local_120 = pHVar18;
            uVar4 = ucvector_resize(&v,(size_t)pHVar18);
            puVar17 = v.data;
            if (uVar4 == 0) goto LAB_0010f041;
            pHVar18 = (HuffmanTree *)(v.data + ((long)pHVar24 - (long)pHVar20));
            if (pHVar20 < pHVar9) {
              lodepng_memcpy(v.data + (long)pHVar24,pHVar18,(size_t)pHVar20);
              lVar23 = (long)&pHVar20->codes + (long)&pHVar24->codes;
              for (lVar11 = 0; (long)pHVar20 - (long)pHVar9 != lVar11; lVar11 = lVar11 + -1) {
                puVar17[lVar23] = puVar17[(long)pHVar24 - (long)pHVar20];
                puVar17 = puVar17 + 1;
              }
              pHVar24 = (HuffmanTree *)(lVar23 - lVar11);
            }
            else {
              lodepng_memcpy(v.data + (long)pHVar24,pHVar18,(size_t)pHVar9);
              pHVar24 = local_120;
            }
          }
          uVar4 = 0;
          uVar10 = local_148.bp;
        } while (local_148.bp <= local_148.bitsize);
        uVar4 = 0x33;
LAB_0010f06a:
        HuffmanTree_cleanup(&tree_ll);
        HuffmanTree_cleanup(&local_88);
        pHVar9 = pHVar24;
      }
      uVar6 = local_104 & 1;
      pHVar24 = pHVar9;
    } while (uVar4 == 0);
  }
  else {
    uVar4 = 0x69;
  }
  *out = v.data;
  *outsize = v.size;
  return uVar4;
}

Assistant:

unsigned lodepng_inflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGDecompressSettings* settings) {
  unsigned error;
  ucvector v;
  ucvector_init_buffer(&v, *out, *outsize);
  error = lodepng_inflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}